

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

void __thiscall
fakeit::RecordedMethodBody<unsigned_long>::~RecordedMethodBody
          (RecordedMethodBody<unsigned_long> *this)

{
  (this->super_MethodInvocationHandler<unsigned_long>).super_Destructible._vptr_Destructible =
       (_func_int **)&PTR__RecordedMethodBody_0012d918;
  (this->super_ActualInvocationsSource)._vptr_ActualInvocationsSource =
       (_func_int **)&PTR_getActualInvocations_0012d950;
  (this->super_ActualInvocationsContainer)._vptr_ActualInvocationsContainer =
       (_func_int **)&PTR_clear_0012d978;
  std::
  vector<std::shared_ptr<fakeit::Destructible>,_std::allocator<std::shared_ptr<fakeit::Destructible>_>_>
  ::~vector(&this->_actualInvocations);
  std::
  vector<std::shared_ptr<fakeit::Destructible>,_std::allocator<std::shared_ptr<fakeit::Destructible>_>_>
  ::~vector(&this->_invocationHandlers);
  std::__cxx11::string::~string((string *)&(this->_method)._name);
  return;
}

Assistant:

virtual ~RecordedMethodBody() NO_THROWS {
        }